

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall
Catch::StreamingReporterBase<Catch::ConsoleReporter>::StreamingReporterBase
          (StreamingReporterBase<Catch::ConsoleReporter> *this,ReporterConfig *_config)

{
  _Rb_tree_color _Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  int iVar3;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  initializer_list<Catch::Verbosity> __l;
  allocator_type local_6a;
  less<Catch::Verbosity> local_69;
  undefined1 local_68 [48];
  ReusableStringStream local_38;
  
  (this->super_IStreamingReporter)._vptr_IStreamingReporter =
       (_func_int **)&PTR__StreamingReporterBase_0028e250;
  (this->m_config).super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (_config->m_fullConfig).super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  p_Var2 = (_config->m_fullConfig).
           super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (this->m_config).super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var2;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  this->stream = _config->m_stream;
  (this->currentTestRunInfo).super_Option<Catch::TestRunInfo>.nullableValue = (TestRunInfo *)0x0;
  (this->currentTestRunInfo).used = false;
  (this->currentGroupInfo).super_Option<Catch::GroupInfo>.nullableValue = (GroupInfo *)0x0;
  (this->currentGroupInfo).used = false;
  (this->currentTestCaseInfo).super_Option<Catch::TestCaseInfo>.nullableValue = (TestCaseInfo *)0x0;
  (this->currentTestCaseInfo).used = false;
  (this->m_sectionStack).super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_sectionStack).super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->m_sectionStack).
           super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>._M_impl.
           super__Vector_impl_data._M_finish + 2) = 0;
  *(undefined8 *)
   ((long)&(this->m_sectionStack).
           super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 2) = 0;
  local_38.super_NonCopyable._vptr_NonCopyable._0_4_ = 1;
  __l._M_len = 1;
  __l._M_array = (iterator)&local_38;
  clara::std::set<Catch::Verbosity,_std::less<Catch::Verbosity>,_std::allocator<Catch::Verbosity>_>
  ::set((set<Catch::Verbosity,_std::less<Catch::Verbosity>,_std::allocator<Catch::Verbosity>_> *)
        local_68,__l,&local_69,&local_6a);
  iVar3 = (*(((this->m_config).super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->super_NonCopyable)._vptr_NonCopyable[0x14])();
  if ((_Base_ptr)local_68._16_8_ != (_Base_ptr)0x0) {
    p_Var6 = (_Base_ptr)(local_68 + 8);
    do {
      p_Var5 = p_Var6;
      p_Var4 = (_Base_ptr)local_68._16_8_;
      _Var1 = p_Var4[1]._M_color;
      p_Var6 = p_Var4;
      if ((int)_Var1 < iVar3) {
        p_Var6 = p_Var5;
      }
      local_68._16_8_ = (&p_Var4->_M_left)[(int)_Var1 < iVar3];
    } while ((&p_Var4->_M_left)[(int)_Var1 < iVar3] != (_Base_ptr)0x0);
    if (p_Var6 != (_Base_ptr)(local_68 + 8)) {
      if ((int)_Var1 < iVar3) {
        p_Var4 = p_Var5;
      }
      _Var1 = p_Var4[1]._M_color;
      clara::std::
      _Rb_tree<Catch::Verbosity,_Catch::Verbosity,_std::_Identity<Catch::Verbosity>,_std::less<Catch::Verbosity>,_std::allocator<Catch::Verbosity>_>
      ::~_Rb_tree((_Rb_tree<Catch::Verbosity,_Catch::Verbosity,_std::_Identity<Catch::Verbosity>,_std::less<Catch::Verbosity>,_std::allocator<Catch::Verbosity>_>
                   *)local_68);
      if ((int)_Var1 <= iVar3) {
        return;
      }
      goto LAB_00146159;
    }
  }
  clara::std::
  _Rb_tree<Catch::Verbosity,_Catch::Verbosity,_std::_Identity<Catch::Verbosity>,_std::less<Catch::Verbosity>,_std::allocator<Catch::Verbosity>_>
  ::~_Rb_tree((_Rb_tree<Catch::Verbosity,_Catch::Verbosity,_std::_Identity<Catch::Verbosity>,_std::less<Catch::Verbosity>,_std::allocator<Catch::Verbosity>_>
               *)local_68);
LAB_00146159:
  ReusableStringStream::ReusableStringStream(&local_38);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_38.m_oss,"Verbosity level not supported by this reporter",0x2e);
  std::__cxx11::stringbuf::str();
  throw_domain_error((string *)local_68);
}

Assistant:

StreamingReporterBase( ReporterConfig const& _config )
        :   m_config( _config.fullConfig() ),
            stream( _config.stream() )
        {
            m_reporterPrefs.shouldRedirectStdOut = false;
            if( !DerivedT::getSupportedVerbosities().count( m_config->verbosity() ) )
                CATCH_ERROR( "Verbosity level not supported by this reporter" );
        }